

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1d144c::BuildSystemFrontendImpl::initialize(BuildSystemFrontendImpl *this)

{
  atomic<unsigned_int> *paVar1;
  unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
  *this_00;
  BuildSystem *this_01;
  ulong uVar2;
  StringRef mainFilename;
  StringRef path;
  _Alloc_hider __p;
  bool bVar3;
  int iVar4;
  FileSystem *pFVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  Style SVar9;
  BuildSystemInvocation *pBVar10;
  BuildSystemFrontendDelegate *pBVar11;
  StringRef path_00;
  StringRef Str;
  StringRef path_01;
  StringRef path_02;
  StringRef local_1d0;
  string error_1;
  StringRef dir;
  string local_188;
  Twine local_168;
  StringRef local_150;
  string error;
  
  std::mutex::lock(&this->stateMutex);
  LOCK();
  (this->delegateImpl->numFailedCommands).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  paVar1 = &this->delegateImpl->numErrors;
  SVar9 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i = 0;
  UNLOCK();
  bVar3 = false;
  if (this->cancelled != false) goto LAB_00148c48;
  this_01 = (this->system)._M_t.
            super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            ._M_t.
            super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>._M_head_impl;
  if (this_01 != (BuildSystem *)0x0) {
    llbuild::buildsystem::BuildSystem::resetForBuild(this_01);
    bVar3 = true;
    goto LAB_00148c48;
  }
  if (((this->invocation->chdirPath)._M_string_length == 0) ||
     (iVar4 = llbuild::basic::sys::chdir((this->invocation->chdirPath)._M_dataplus._M_p),
     (char)iVar4 != '\0')) {
    if ((this->fileSystem)._M_t.
        super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
        ._M_t.
        super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
        .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl !=
        (FileSystem *)0x0) {
      this_00 = &this->system;
      std::
      make_unique<llbuild::buildsystem::BuildSystem,llbuild::buildsystem::BuildSystemFrontendDelegate&,std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>>
                ((BuildSystemFrontendDelegate *)&error,
                 (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                  *)this->delegate);
      __p = error._M_dataplus;
      error._M_dataplus._M_p = (pointer)0x0;
      std::
      __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
      ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
               *)this_00,(pointer)__p._M_p);
      std::
      unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
      ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                     *)&error);
      mainFilename.Data = (this->invocation->buildFilePath)._M_dataplus._M_p;
      mainFilename.Length = (this->invocation->buildFilePath)._M_string_length;
      bVar3 = llbuild::buildsystem::BuildSystem::loadDescription
                        ((this->system)._M_t.
                         super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                         _M_head_impl,mainFilename);
      if (bVar3) {
        pBVar10 = this->invocation;
        pcVar7 = (char *)(pBVar10->traceFilePath)._M_string_length;
        if (pcVar7 != (char *)0x0) {
          path_00.Length = 2;
          path_00.Data = pcVar7;
          dir = llvm::sys::path::parent_path
                          ((path *)(pBVar10->traceFilePath)._M_dataplus._M_p,path_00,SVar9);
          pFVar5 = llbuild::buildsystem::BuildSystem::getFileSystem
                             ((this_00->_M_t).
                              super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                              .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                              _M_head_impl);
          llvm::StringRef::str_abi_cxx11_(&error_1,&dir);
          iVar4 = (*pFVar5->_vptr_FileSystem[3])(pFVar5,&error_1);
          if ((char)iVar4 == '\0') {
            pFVar5 = llbuild::buildsystem::BuildSystem::getFileSystem
                               ((this_00->_M_t).
                                super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                                .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                                _M_head_impl);
            llvm::StringRef::str_abi_cxx11_(&local_188,&dir);
            (*pFVar5->_vptr_FileSystem[7])((FileInfo *)&error,pFVar5,&local_188);
            bVar3 = llbuild::basic::FileInfo::isDirectory((FileInfo *)&error);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            if (!bVar3) {
              pBVar11 = this->delegate;
              llvm::Twine::Twine((Twine *)&error,"unable to create tracing directory: ",&dir);
              llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar11,(Twine *)&error);
              goto LAB_00148c3b;
            }
          }
          else {
            std::__cxx11::string::_M_dispose();
          }
          error._M_dataplus._M_p = (pointer)&error.field_2;
          error._M_string_length = 0;
          error.field_2._M_local_buf[0] = '\0';
          path.Data = (this->invocation->traceFilePath)._M_dataplus._M_p;
          path.Length = (this->invocation->traceFilePath)._M_string_length;
          bVar3 = llbuild::buildsystem::BuildSystem::enableTracing
                            ((this->system)._M_t.
                             super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                             .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                             _M_head_impl,path,&error);
          if (!bVar3) {
            pBVar11 = this->delegate;
            llvm::Twine::Twine((Twine *)&local_188,"unable to enable tracing: ");
            llvm::Twine::Twine(&local_168,&error);
            llvm::Twine::concat((Twine *)&error_1,(Twine *)&local_188,&local_168);
            llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar11,(Twine *)&error_1);
            bVar3 = false;
            std::
            __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                     *)this_00,(pointer)0x0);
            std::__cxx11::string::_M_dispose();
            goto LAB_00148c48;
          }
          std::__cxx11::string::_M_dispose();
          pBVar10 = this->invocation;
        }
        uVar2 = (pBVar10->dbPath)._M_string_length;
        bVar3 = true;
        if (uVar2 != 0) {
          error._M_dataplus._M_p = (pointer)&error.field_2;
          error._M_string_length = 0x10000000000;
          local_1d0.Data = (pBVar10->dbPath)._M_dataplus._M_p;
          local_1d0.Length = uVar2;
          llvm::Twine::Twine((Twine *)&error_1,&pBVar10->dbPath);
          bVar3 = llvm::sys::path::is_relative((Twine *)&error_1,native);
          if (bVar3) {
            SVar9 = windows;
            Str.Length = 3;
            Str.Data = "://";
            sVar8 = llvm::StringRef::find(&local_1d0,Str,0);
            if ((sVar8 == 0xffffffffffffffff) &&
               ((local_1d0.Length == 0 || (*local_1d0.Data != ':')))) {
              path_02.Length = 2;
              path_02.Data = (char *)(this->invocation->buildFilePath)._M_string_length;
              local_150 = llvm::sys::path::parent_path
                                    ((path *)(this->invocation->buildFilePath)._M_dataplus._M_p,
                                     path_02,SVar9);
              llvm::Twine::Twine((Twine *)&error_1,&local_150);
              llvm::Twine::Twine((Twine *)&local_188,&this->invocation->dbPath);
              llvm::Twine::Twine(&local_168,"");
              llvm::Twine::Twine((Twine *)&dir,"");
              llvm::sys::path::append
                        ((SmallVectorImpl<char> *)&error,(Twine *)&error_1,(Twine *)&local_188,
                         &local_168,(Twine *)&dir);
              local_1d0.Data = error._M_dataplus._M_p;
              local_1d0.Length = error._M_string_length & 0xffffffff;
            }
          }
          error_1._M_dataplus._M_p = (pointer)&error_1.field_2;
          error_1._M_string_length = 0;
          error_1.field_2._M_local_buf[0] = '\0';
          path_01.Length = local_1d0.Length;
          path_01.Data = local_1d0.Data;
          bVar3 = llbuild::buildsystem::BuildSystem::attachDB
                            ((this_00->_M_t).
                             super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                             .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                             _M_head_impl,path_01,&error_1);
          if (!bVar3) {
            pBVar11 = this->delegate;
            llvm::Twine::Twine(&local_168,"unable to attach DB: ");
            llvm::Twine::Twine((Twine *)&dir,&error_1);
            llvm::Twine::concat((Twine *)&local_188,&local_168,(Twine *)&dir);
            llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar11,(Twine *)&local_188);
            std::
            __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                     *)this_00,(pointer)0x0);
          }
          std::__cxx11::string::_M_dispose();
          llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&error);
        }
      }
      else {
LAB_00148c3b:
        bVar3 = false;
        std::
        __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
        ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                 *)this_00,(pointer)0x0);
      }
      goto LAB_00148c48;
    }
    pBVar11 = this->delegate;
    llvm::Twine::Twine((Twine *)&error,"invalid reuse after initialization failure");
  }
  else {
    pBVar11 = this->delegate;
    llvm::Twine::Twine((Twine *)&error_1,"unable to honor --chdir: ");
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    llvm::Twine::Twine((Twine *)&local_188,pcVar7);
    llvm::Twine::concat((Twine *)&error,(Twine *)&error_1,(Twine *)&local_188);
  }
  llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar11,(Twine *)&error);
  bVar3 = false;
LAB_00148c48:
  pthread_mutex_unlock((pthread_mutex_t *)&this->stateMutex);
  return bVar3;
}

Assistant:

bool initialize() {
    std::lock_guard<std::mutex> lock(stateMutex);

    delegateImpl->numFailedCommands = 0;
    delegateImpl->numErrors = 0;

    if (cancelled)
      return false;

    if (system) {
      // Already exists, just reset state
      system->resetForBuild();
      return true;
    }

    if (!invocation.chdirPath.empty()) {
      if (!sys::chdir(invocation.chdirPath.c_str())) {
        delegate.error(Twine("unable to honor --chdir: ") + strerror(errno));
        return false;
      }
    }

    if (!fileSystem) {
      // Catch and report client misuse of a failed build system object
      delegate.error(Twine("invalid reuse after initialization failure"));
      return false;
    }

    // Create the build system.
    system = std::make_unique<BuildSystem>(delegate, std::move(fileSystem));

    // Load the build file.
    if (!system->loadDescription(invocation.buildFilePath)) {
      system = nullptr;
      return false;
    }

    // Enable tracing, if requested.
    if (!invocation.traceFilePath.empty()) {
      const auto dir = llvm::sys::path::parent_path(invocation.traceFilePath);
      if (!system->getFileSystem().createDirectories(dir) &&
          !system->getFileSystem().getFileInfo(dir).isDirectory()) {
        delegate.error(Twine("unable to create tracing directory: " + dir));
        system = nullptr;
        return false;
      }

      std::string error;
      if (!system->enableTracing(invocation.traceFilePath, &error)) {
        delegate.error(Twine("unable to enable tracing: ") + error);
        system = nullptr;
        return false;
      }
    }

    // Attach the database.
    if (!invocation.dbPath.empty()) {
      // If the database path is relative, always make it relative to the input
      // file.
      SmallString<256> tmp;
      StringRef dbPath = invocation.dbPath;
      if (llvm::sys::path::is_relative(invocation.dbPath) &&
          dbPath.find("://") == StringRef::npos && !dbPath.startswith(":")) {
        llvm::sys::path::append(
            tmp, llvm::sys::path::parent_path(invocation.buildFilePath),
            invocation.dbPath);
        dbPath = tmp.str();
      }

      std::string error;
      if (!system->attachDB(dbPath, &error)) {
        delegate.error(Twine("unable to attach DB: ") + error);
        system = nullptr;
        return false;
      }
    }

    return true;
  }